

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O3

void LowererMD::EmitNon32BitOvfCheck(Instr *instr,Instr *insertInstr,LabelInstr *bailOutLabel)

{
  Func *pFVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  undefined4 *puVar5;
  RegOpnd *dstOpnd;
  Instr *pIVar6;
  RegOpnd *dstOpnd_00;
  IntConstOpnd *pIVar7;
  
  if (instr->m_opcode != IMUL) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x1c01,"(instr->m_opcode == Js::OpCode::IMUL)",
                       "IMUL should be used to check for non-32 bit overflow check on x86.");
    if (!bVar3) goto LAB_0065eda2;
    *puVar5 = 0;
  }
  dstOpnd = IR::RegOpnd::New(TyInt32,instr->m_func);
  dstOpnd->m_reg = RegArg2;
  pIVar6 = IR::Instr::New(NOP,&dstOpnd->super_Opnd,instr->m_func);
  IR::Instr::InsertBefore(insertInstr,pIVar6);
  dstOpnd_00 = IR::RegOpnd::New(TyInt32,instr->m_func);
  bVar4 = instr->ignoreOverflowBitCount;
  if (bVar4 < 0x21) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x1c0f,"(instr->ignoreOverflowBitCount > 32)",
                       "instr->ignoreOverflowBitCount > 32");
    if (!bVar3) goto LAB_0065eda2;
    *puVar5 = 0;
    bVar4 = instr->ignoreOverflowBitCount;
  }
  pIVar6 = IR::Instr::New(MOV,&dstOpnd_00->super_Opnd,&dstOpnd->super_Opnd,instr->m_func);
  IR::Instr::InsertBefore(insertInstr,pIVar6);
  pIVar7 = IR::IntConstOpnd::New((ulong)(byte)(0x40 - bVar4),TyInt8,instr->m_func,true);
  pIVar6 = IR::Instr::New(SHL,&dstOpnd_00->super_Opnd,&dstOpnd_00->super_Opnd,&pIVar7->super_Opnd,
                          instr->m_func);
  IR::Instr::InsertBefore(insertInstr,pIVar6);
  pIVar7 = IR::IntConstOpnd::New((ulong)(byte)(0x40 - bVar4),TyInt8,instr->m_func,true);
  pIVar6 = IR::Instr::New(SAR,&dstOpnd_00->super_Opnd,&dstOpnd_00->super_Opnd,&pIVar7->super_Opnd,
                          instr->m_func);
  IR::Instr::InsertBefore(insertInstr,pIVar6);
  pIVar6 = IR::Instr::New(CMP,instr->m_func);
  if (pIVar6->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_0065eda2;
    *puVar5 = 0;
  }
  pFVar1 = pIVar6->m_func;
  if ((dstOpnd_00->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) goto LAB_0065eda2;
    *puVar5 = 0;
  }
  bVar4 = (dstOpnd_00->super_Opnd).field_0xb;
  if ((bVar4 & 2) != 0) {
    dstOpnd_00 = (RegOpnd *)IR::Opnd::Copy(&dstOpnd_00->super_Opnd,pFVar1);
    bVar4 = (dstOpnd_00->super_Opnd).field_0xb;
  }
  (dstOpnd_00->super_Opnd).field_0xb = bVar4 | 2;
  pIVar6->m_src1 = &dstOpnd_00->super_Opnd;
  if (pIVar6->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_0065eda2;
    *puVar5 = 0;
  }
  pFVar1 = pIVar6->m_func;
  if ((dstOpnd->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) {
LAB_0065eda2:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  bVar4 = (dstOpnd->super_Opnd).field_0xb;
  if ((bVar4 & 2) != 0) {
    dstOpnd = (RegOpnd *)IR::Opnd::Copy(&dstOpnd->super_Opnd,pFVar1);
    bVar4 = (dstOpnd->super_Opnd).field_0xb;
  }
  (dstOpnd->super_Opnd).field_0xb = bVar4 | 2;
  pIVar6->m_src2 = &dstOpnd->super_Opnd;
  IR::Instr::InsertBefore(insertInstr,pIVar6);
  Lowerer::InsertBranch(JNE,false,bailOutLabel,insertInstr);
  return;
}

Assistant:

void
LowererMD::EmitNon32BitOvfCheck(IR::Instr *instr, IR::Instr *insertInstr, IR::LabelInstr* bailOutLabel)
{
    AssertMsg(instr->m_opcode == Js::OpCode::IMUL, "IMUL should be used to check for non-32 bit overflow check on x86.");

    IR::RegOpnd *edxSym = IR::RegOpnd::New(TyInt32, instr->m_func);
#ifdef _M_IX86
    edxSym->SetReg(RegEDX);
#else
    edxSym->SetReg(RegRDX);
#endif

    // dummy def for edx to force RegAlloc to generate a lifetime. This is removed later by the Peeps phase.
    IR::Instr *newInstr = IR::Instr::New(Js::OpCode::NOP, edxSym, instr->m_func);
    insertInstr->InsertBefore(newInstr);

    IR::RegOpnd *temp = IR::RegOpnd::New(TyInt32, instr->m_func);
    Assert(instr->ignoreOverflowBitCount > 32);
    uint8 shamt = 64 - instr->ignoreOverflowBitCount;

    // MOV temp, edx
    newInstr = IR::Instr::New(Js::OpCode::MOV, temp, edxSym, instr->m_func);
    insertInstr->InsertBefore(newInstr);

    // SHL temp, shamt
    newInstr = IR::Instr::New(Js::OpCode::SHL, temp, temp, IR::IntConstOpnd::New(shamt, TyInt8, instr->m_func, true), instr->m_func);
    insertInstr->InsertBefore(newInstr);

    // SAR temp, shamt
    newInstr = IR::Instr::New(Js::OpCode::SAR, temp, temp, IR::IntConstOpnd::New(shamt, TyInt8, instr->m_func, true), instr->m_func);
    insertInstr->InsertBefore(newInstr);

    // CMP temp, edx
    newInstr = IR::Instr::New(Js::OpCode::CMP, instr->m_func);
    newInstr->SetSrc1(temp);
    newInstr->SetSrc2(edxSym);
    insertInstr->InsertBefore(newInstr);

    // JNE
    Lowerer::InsertBranch(Js::OpCode::JNE, false, bailOutLabel, insertInstr);
}